

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  size_t local_110;
  size_t n_2;
  size_t max_index;
  ulong uStack_f8;
  int scanf_res;
  size_t n_1;
  size_t n;
  char raw [65];
  byte local_9a;
  byte local_99;
  uint8_t local_98 [6];
  uint8_t to;
  uint8_t from;
  uint8_t num [64];
  uint8_t res [64];
  char **argv_local;
  int argc_local;
  
  local_99 = 0;
  local_9a = 0;
  n._0_1_ = '\n';
  while ((char)n == '\n') {
    printf("Please enter a number: ");
    pcVar1 = fgets((char *)&n,0x41,_stdin);
    if (pcVar1 == (char *)0x0) {
      printf("\n");
      return 0;
    }
  }
  for (n_1 = 0; n_1 < 0x40; n_1 = n_1 + 1) {
    local_98[n_1] = '\0';
  }
  for (uStack_f8 = 0;
      ((uStack_f8 < 0x40 && (raw[uStack_f8 - 8] != '\n')) && (raw[uStack_f8 - 8] != '\0'));
      uStack_f8 = uStack_f8 + 1) {
    if ((raw[uStack_f8 - 8] < '0') || ('9' < raw[uStack_f8 - 8])) {
      printf("Invalid number!");
      return 1;
    }
    local_98[uStack_f8] = raw[uStack_f8 - 8] + 0xd0;
  }
  printf("What base is the number you just entered (2-10)? ");
  max_index._4_4_ = 0;
  while (max_index._4_4_ == 0) {
    max_index._4_4_ = __isoc99_scanf("%hhu",&local_99);
    if (max_index._4_4_ == -1) {
      printf("\n");
      return 0;
    }
    if ((((max_index._4_4_ == 0) || (local_99 < 2)) || (10 < local_99)) &&
       (printf("This isn\'t a valid number!\n"), max_index._4_4_ == 0)) {
      __isoc99_scanf("%*[^\n]");
    }
  }
  printf("What base do you want to convert it to (2-10)? ");
  max_index._4_4_ = 0;
  while( true ) {
    if (max_index._4_4_ != 0) {
      local_110 = change_base(local_98,local_99,local_9a,num + 0x38);
      if (local_110 == 0xffffffffffffffff) {
        printf("Couldn\'t change base: this is likely due to an overflow.\n");
      }
      else {
        printf("Your modified number is: ");
        for (; local_110 != 0xffffffffffffffff; local_110 = local_110 - 1) {
          printf("%c",(ulong)(num[local_110 + 0x38] + 0x30));
        }
        printf("\n");
      }
      return 0;
    }
    max_index._4_4_ = __isoc99_scanf("%hhu",&local_9a);
    if (max_index._4_4_ == -1) break;
    if ((((max_index._4_4_ == 0) || (local_9a < 2)) || (10 < local_9a)) &&
       (printf("This isn\'t a valid number!\n"), max_index._4_4_ == 0)) {
      __isoc99_scanf("%*[^\n]");
    }
  }
  printf("\n");
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  uint8_t res[64], num[64];
  uint8_t from = 0, to = 0;

  char raw[65];
  raw[0] = '\n';

  while (raw[0] == '\n') {
    printf("Please enter a number: ");
    if (fgets(raw, sizeof raw, stdin) == NULL) {
      printf("\n");
      return 0;
    }
  }

  for (size_t n = 0; n < 64; n++) num[n] = 0;

  for (size_t n = 0; n < 64; n++) {
    if (raw[n] == '\n' || raw[n] == 0) break;
    if (raw[n] < '0' || raw[n] > '9') {
      printf("Invalid number!");
      return 1;
    }
    num[n] = (uint8_t)(raw[n] - '0');
  }

  printf("What base is the number you just entered (2-10)? ");
  int scanf_res = 0;
  while (scanf_res == 0) {
    scanf_res = scanf("%" SCNu8, &from);
    if (scanf_res == EOF) {
      printf("\n");
      return 0;
    } else if (scanf_res == 0 || from <= 1 || from > 10) {
      printf("This isn't a valid number!\n");
      if (scanf_res == 0) scanf("%*[^\n]");
    }
  }

  printf("What base do you want to convert it to (2-10)? ");
  scanf_res = 0;
  while (scanf_res == 0) {
    scanf_res = scanf("%" SCNu8, &to);
    if (scanf_res == EOF) {
      printf("\n");
      return 0;
    } else if (scanf_res == 0 || to <= 1 || to > 10) {
      printf("This isn't a valid number!\n");
      if (scanf_res == 0) scanf("%*[^\n]");
    }
  }

  size_t max_index = change_base(num, from, to, res);

  if (max_index != (size_t)(-1)) {
    printf("Your modified number is: ");
    for (size_t n = max_index; n != (size_t)(-1); n--) {
      printf("%c", res[n] + '0');
    }
    printf("\n");
  } else {
    printf("Couldn't change base: this is likely due to an overflow.\n");
  }

  return 0;
}